

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void put2bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  uint32_t **ppuVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  
  if (h != 0) {
    iVar3 = fromskew + 3;
    if (-1 < fromskew) {
      iVar3 = fromskew;
    }
    ppuVar2 = img->PALmap;
    do {
      uVar4 = w;
      if (3 < w) {
        do {
          bVar1 = *pp;
          pp = pp + 1;
          puVar5 = ppuVar2[bVar1];
          *cp = *puVar5;
          cp[1] = puVar5[1];
          cp[2] = puVar5[2];
          cp[3] = puVar5[3];
          cp = cp + 4;
          uVar4 = uVar4 - 4;
        } while (3 < uVar4);
      }
      if (uVar4 != 0) {
        puVar5 = ppuVar2[*pp];
        if (uVar4 != 1) {
          if (uVar4 != 2) {
            uVar4 = *puVar5;
            puVar5 = puVar5 + 1;
            *cp = uVar4;
            cp = cp + 1;
          }
          uVar4 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar4;
          cp = cp + 1;
        }
        pp = pp + 1;
        *cp = *puVar5;
        cp = cp + 1;
      }
      pp = pp + (iVar3 >> 2);
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put2bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;

    (void)x;
    (void)y;
    fromskew /= 4;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL4(w, bw = PALmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}